

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void NOPN2_UpdateLFO(ym3438_t *chip)

{
  Bit8u BVar1;
  byte bVar2;
  
  if ((lfo_samples_per_step[chip->lfo_freq] & ~(uint)chip->lfo_quotient) == 0) {
    bVar2 = chip->lfo_cnt + 1;
    BVar1 = '\0';
  }
  else {
    BVar1 = chip->lfo_quotient + chip->lfo_inc;
    bVar2 = chip->lfo_cnt;
  }
  chip->lfo_quotient = BVar1;
  chip->lfo_cnt = bVar2 & chip->lfo_en;
  return;
}

Assistant:

void NOPN2_UpdateLFO(ym3438_t *chip)
{
    if ((chip->lfo_quotient & lfo_cycles[chip->lfo_freq]) == lfo_cycles[chip->lfo_freq])
    {
        chip->lfo_quotient = 0;
        chip->lfo_cnt++;
    }
    else
    {
        chip->lfo_quotient += chip->lfo_inc;
    }
    chip->lfo_cnt &= chip->lfo_en;
}